

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O0

int i2d_SSL_SESSION_bio(BIO *bio,SSL_SESSION *session)

{
  int iVar1;
  unique_ptr<unsigned_char,_bssl::internal::Deleter> local_38;
  UniquePtr<uint8_t> free_data;
  size_t len;
  uint8_t *data;
  SSL_SESSION *session_local;
  BIO *bio_local;
  
  data = (uint8_t *)session;
  session_local = (SSL_SESSION *)bio;
  iVar1 = SSL_SESSION_to_bytes(session,(uint8_t **)&len,(size_t *)&free_data);
  if (iVar1 == 0) {
    bio_local._4_4_ = 0;
  }
  else {
    std::unique_ptr<unsigned_char,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)&local_38,(pointer)len);
    bio_local._4_4_ =
         BIO_write_all((BIO *)session_local,(void *)len,
                       (size_t)free_data._M_t.
                               super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
    std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&local_38);
  }
  return bio_local._4_4_;
}

Assistant:

int i2d_SSL_SESSION_bio(BIO *bio, const SSL_SESSION *session) {
  uint8_t *data;
  size_t len;
  if (!SSL_SESSION_to_bytes(session, &data, &len)) {
    return 0;
  }
  bssl::UniquePtr<uint8_t> free_data(data);
  return BIO_write_all(bio, data, len);
}